

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O1

void grasshopper_encrypt_block
               (grasshopper_round_keys_t *subkeys,grasshopper_w128_t *source,
               grasshopper_w128_t *target,grasshopper_w128_t *buffer)

{
  byte bVar1;
  int i;
  long lVar2;
  long lVar3;
  grasshopper_w128_t *pgVar4;
  int i_1;
  long lVar5;
  grasshopper_w128_t (*pagVar6) [256];
  
  lVar2 = 0;
  do {
    target->q[lVar2] = source->q[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  lVar2 = 0;
  pgVar4 = subkeys->k;
  do {
    lVar5 = 0;
    do {
      target->q[lVar5] = target->q[lVar5] ^ pgVar4->q[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    buffer->q[0] = 0;
    buffer->q[1] = 0;
    pagVar6 = grasshopper_pil_enc128;
    lVar5 = 0;
    do {
      bVar1 = target->b[lVar5];
      lVar3 = 0;
      do {
        buffer->q[lVar3] =
             buffer->q[lVar3] ^ *(ulong *)((long)*pagVar6 + lVar3 * 8 + (ulong)bVar1 * 0x10);
        lVar3 = lVar3 + 1;
      } while (lVar3 == 1);
      lVar5 = lVar5 + 1;
      pagVar6 = pagVar6 + 1;
    } while (lVar5 != 0x10);
    lVar5 = 0;
    do {
      target->q[lVar5] = buffer->q[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    lVar2 = lVar2 + 1;
    pgVar4 = pgVar4 + 1;
  } while (lVar2 != 9);
  lVar2 = 0;
  do {
    target->q[lVar2] = target->q[lVar2] ^ *(ulong *)((long)subkeys->k + lVar2 * 8 + 0x90);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return;
}

Assistant:

void grasshopper_encrypt_block(grasshopper_round_keys_t* subkeys, grasshopper_w128_t* source,
                               grasshopper_w128_t* target, grasshopper_w128_t* buffer) {
    int i;
    grasshopper_copy128(target, source);

    for (i = 0; i < 9; i++) {
        grasshopper_append128(target, &subkeys->k[i]);
        grasshopper_append128multi(buffer, target, grasshopper_pil_enc128);
    }

    grasshopper_append128(target, &subkeys->k[9]);
}